

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  undefined8 uVar1;
  ssize_t sVar2;
  FTP *data_00;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  timeval tVar7;
  size_t local_a0;
  __time_t local_90;
  __suseconds_t local_88;
  long old_time;
  size_t dlen;
  size_t flen;
  char *path_to_use;
  char *path;
  CURLcode local_50;
  uint uStack_4c;
  _Bool was_ctl_valid;
  CURLcode result;
  int ftpcode;
  ssize_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  FTP *ftp;
  SessionHandle *data;
  _Bool premature_local;
  connectdata *pcStack_18;
  CURLcode status_local;
  connectdata *conn_local;
  
  ftp = (FTP *)conn->data;
  ftpc = (ftp_conn *)(((SessionHandle *)ftp)->req).protop;
  nread = (ssize_t)&conn->proto;
  local_50 = CURLE_OK;
  pcVar4 = (((SessionHandle *)ftp)->state).path;
  if (ftpc == (ftp_conn *)0x0) {
    return CURLE_OK;
  }
  switch(status) {
  case CURLE_OK:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_PARTIAL_FILE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_WRITE_ERROR:
  case CURLE_UPLOAD_FAILED:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
    if (!premature) {
      (conn->proto).ftpc.ctl_valid = (_Bool)((conn->proto).ftpc.ctl_valid & 1);
      goto LAB_0014f429;
    }
  }
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = true;
  (conn->bits).close = true;
  local_50 = status;
LAB_0014f429:
  pp = (pingpong *)nread;
  data._3_1_ = premature;
  data._4_4_ = status;
  pcStack_18 = conn;
  if ((conn->proto).ftpc.prevpath != (char *)0x0) {
    (*Curl_cfree)((conn->proto).ftpc.prevpath);
  }
  if (((ulong)ftp[0x28].passwd & 1) != 0) {
    if ((ftp[0x28].downloadsize != 0) && (pp[1].linestart_resp != (char *)0x0)) {
      (*(code *)ftp[0x28].downloadsize)(ftp[0x377].user);
    }
    pp[1].conn = (connectdata *)0xffffffffffffffff;
  }
  pcVar4 = curl_easy_unescape(ftp,pcVar4,0,(int *)0x0);
  if (pcVar4 == (char *)0x0) {
    if (local_50 == CURLE_OK) {
      local_50 = CURLE_OUT_OF_MEMORY;
    }
    pp[1].field_0x21 = 0;
    (pcStack_18->bits).close = true;
    pp[1].sendthis = (char *)0x0;
  }
  else {
    if (pp[1].linestart_resp == (char *)0x0) {
      local_a0 = 0;
    }
    else {
      local_a0 = strlen(pp[1].linestart_resp);
    }
    sVar5 = strlen(pcVar4);
    if ((pp[1].field_0x23 & 1) == 0) {
      if ((sVar5 - local_a0 == 0) || (*(int *)&ftp[0x1c].user == 2)) {
        pcVar6 = (*Curl_cstrdup)("");
        pp[1].sendthis = pcVar6;
        (*Curl_cfree)(pcVar4);
      }
      else {
        pp[1].sendthis = pcVar4;
        if (local_a0 != 0) {
          pp[1].sendthis[sVar5 - local_a0] = '\0';
        }
      }
      if (pp[1].sendthis != (char *)0x0) {
        Curl_infof((SessionHandle *)ftp,"Remembering we are in dir \"%s\"\n",pp[1].sendthis);
      }
    }
    else {
      pp[1].sendthis = (char *)0x0;
      (*Curl_cfree)(pcVar4);
    }
  }
  freedirs((ftp_conn *)pp);
  if (pcStack_18->sock[1] != -1) {
    if ((((local_50 == CURLE_OK) && ((pp[1].pending_resp & 1U) != 0)) && (0 < (long)ftp[3].passwd))
       && (local_50 = Curl_pp_sendf((pingpong *)nread,"%s","ABOR"), data_00 = ftp,
          local_50 != CURLE_OK)) {
      pcVar4 = curl_easy_strerror(local_50);
      Curl_failf((SessionHandle *)data_00,"Failure sending ABOR command: %s",pcVar4);
      pp[1].field_0x21 = 0;
      (pcStack_18->bits).close = true;
    }
    if (pcStack_18->sock[1] != -1) {
      Curl_closesocket(pcStack_18,pcStack_18->sock[1]);
      pcStack_18->sock[1] = -1;
      (pcStack_18->bits).tcpconnect[1] = false;
    }
  }
  sVar2 = nread;
  if (((local_50 == CURLE_OK) && (*(int *)&(ftpc->pp).linestart_resp == 0)) &&
     (((pp[1].field_0x21 & 1) != 0 &&
      (((*(byte *)(nread + 0x20) & 1) != 0 && ((data._3_1_ & 1) == 0)))))) {
    uVar1 = *(undefined8 *)(nread + 0x50);
    *(undefined8 *)(nread + 0x50) = 60000;
    tVar7 = curlx_tvnow();
    local_90 = tVar7.tv_sec;
    *(__time_t *)(sVar2 + 0x40) = local_90;
    local_88 = tVar7.tv_usec;
    *(__suseconds_t *)(sVar2 + 0x48) = local_88;
    CVar3 = Curl_GetFTPResponse((ssize_t *)&result,pcStack_18,(int *)&stack0xffffffffffffffb4);
    *(undefined8 *)(nread + 0x50) = uVar1;
    if ((_result == 0) && (CVar3 == CURLE_OPERATION_TIMEDOUT)) {
      Curl_failf((SessionHandle *)ftp,"control connection looks dead");
      pp[1].field_0x21 = 0;
      (pcStack_18->bits).close = true;
    }
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    if (((pp[1].pending_resp & 1U) != 0) && (0 < (long)ftp[3].passwd)) {
      Curl_infof((SessionHandle *)ftp,"partial download completed, closing connection\n");
      (pcStack_18->bits).close = true;
      return CURLE_OK;
    }
    local_50 = CURLE_OK;
    if ((((pp[1].pending_resp & 1U) == 0) && (uStack_4c != 0xe2)) && (uStack_4c != 0xfa)) {
      Curl_failf((SessionHandle *)ftp,"server did not report OK, got %d",(ulong)uStack_4c);
      local_50 = CURLE_PARTIAL_FILE;
    }
  }
  if ((local_50 == CURLE_OK) && ((data._3_1_ & 1) == 0)) {
    if (((ulong)ftp[0x1d].user & 0x100) == 0) {
      if (((ftp[3].bytecountp == (curl_off_t *)0xffffffffffffffff) ||
          (ftp[3].bytecountp == *(curl_off_t **)(ftpc->pp).cache)) ||
         (((long)ftp[3].bytecountp + ftp[0x373].downloadsize == *(long *)(ftpc->pp).cache ||
          (ftp[3].passwd == *(char **)(ftpc->pp).cache)))) {
        if ((((pp[1].pending_resp & 1U) == 0) && (*(long *)(ftpc->pp).cache == 0)) &&
           (0 < (long)ftp[3].bytecountp)) {
          Curl_failf((SessionHandle *)ftp,"No data was received!");
          local_50 = CURLE_FTP_COULDNT_RETR_FILE;
        }
      }
      else {
        Curl_failf((SessionHandle *)ftp,"Received only partial file: %ld bytes",
                   *(undefined8 *)(ftpc->pp).cache);
        local_50 = CURLE_PARTIAL_FILE;
      }
    }
    else if (((ftp[0x375].downloadsize != -1) &&
             (ftp[0x375].downloadsize != *(long *)(ftpc->pp).cache)) &&
            ((((ulong)ftp[0x15].passwd & 0x10000) == 0 && (*(int *)&(ftpc->pp).linestart_resp == 0))
            )) {
      Curl_failf((SessionHandle *)ftp,"Uploaded unaligned file size (%ld out of %ld bytes)",
                 *(undefined8 *)(ftpc->pp).cache,ftp[0x375].downloadsize);
      local_50 = CURLE_PARTIAL_FILE;
    }
  }
  *(undefined4 *)&(ftpc->pp).linestart_resp = 0;
  pp[1].pending_resp = false;
  if (((data._4_4_ == CURLE_OK) && (local_50 == CURLE_OK)) &&
     (((data._3_1_ & 1) == 0 && (ftp[0x15].downloadsize != 0)))) {
    local_50 = ftp_sendquote(pcStack_18,(curl_slist *)ftp[0x15].downloadsize);
  }
  return local_50;
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                              bool premature)
{
  struct SessionHandle *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  bool was_ctl_valid = ftpc->ctl_valid;
  char *path;
  const char *path_to_use = data->state.path;

  if(!ftp)
    /* When the easy handle is removed from the multi while libcurl is still
     * trying to resolve the host name, it seems that the ftp struct is not
     * yet initialized, but the removal action calls Curl_done() which calls
     * this function. So we simply return success if no ftp pointer is set.
     */
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature) {
      ftpc->ctl_valid = was_ctl_valid;
      break;
    }
    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  /* now store a copy of the directory we are in */
  if(ftpc->prevpath)
    free(ftpc->prevpath);

  if(data->set.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      data->set.chunk_end(data->wildcard.customptr);
    }
    ftpc->known_filesize = -1;
  }

  /* get the "raw" path */
  path = curl_easy_unescape(data, path_to_use, 0, NULL);
  if(!path) {
    /* out of memory, but we can limp along anyway (and should try to
     * since we may already be in the out of memory cleanup path) */
    if(!result)
      result = CURLE_OUT_OF_MEMORY;
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else {
    size_t flen = ftpc->file?strlen(ftpc->file):0; /* file is "raw" already */
    size_t dlen = strlen(path)-flen;
    if(!ftpc->cwdfail) {
      if(dlen && (data->set.ftp_filemethod != FTPFILE_NOCWD)) {
        ftpc->prevpath = path;
        if(flen)
          /* if 'path' is not the whole string */
          ftpc->prevpath[dlen]=0; /* terminate */
      }
      else {
        /* we never changed dir */
        ftpc->prevpath=strdup("");
        free(path);
      }
      if(ftpc->prevpath)
        infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
    }
    else {
      ftpc->prevpath = NULL; /* no path */
      free(path);
    }
  }
  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET],2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    if(CURL_SOCKET_BAD != conn->sock[SECONDARYSOCKET]) {
      Curl_closesocket(conn, conn->sock[SECONDARYSOCKET]);
      conn->sock[SECONDARYSOCKET] = CURL_SOCKET_BAD;
      conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
    }
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_tvnow(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != *ftp->bytecountp) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            *ftp->bytecountp, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != *ftp->bytecountp) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        *ftp->bytecountp) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != *ftp->bytecountp)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", *ftp->bytecountp);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !*ftp->bytecountp &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);

  return result;
}